

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MeanSquaredErrorLossLayer::SerializeWithCachedSizes
          (MeanSquaredErrorLossLayer *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  psVar1 = (this->input_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.MeanSquaredErrorLossLayer.input");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (1,(this->input_).ptr_,output);
  }
  psVar1 = (this->target_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.MeanSquaredErrorLossLayer.target");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (2,(this->target_).ptr_,output);
    return;
  }
  return;
}

Assistant:

void MeanSquaredErrorLossLayer::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.MeanSquaredErrorLossLayer)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // string input = 1;
  if (this->input().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->input().data(), this->input().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MeanSquaredErrorLossLayer.input");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->input(), output);
  }

  // string target = 2;
  if (this->target().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->target().data(), this->target().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.MeanSquaredErrorLossLayer.target");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      2, this->target(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.MeanSquaredErrorLossLayer)
}